

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float extraout_XMM0_Db;
  undefined1 extraout_var [12];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar18 [16];
  Mat local_78;
  
  uVar11 = 0;
  iVar5 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar5;
  iVar5 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar5;
  iVar5 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar5;
  iVar5 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar5;
  fVar13 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar13;
  iVar5 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar5;
  iVar5 = this->base_size;
  uVar1 = (this->ratios).w;
  uVar2 = (this->scales).w;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,4,uVar2 * uVar1,4,(Allocator *)0x0);
  auVar16._0_4_ = (float)iVar5;
  auVar16._4_12_ = extraout_var;
  fVar13 = auVar16._0_4_ * 0.5;
  pvVar3 = (this->ratios).data;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  uVar12 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar12 = uVar11;
  }
  auVar17 = auVar16;
  for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
    fVar15 = *(float *)((long)pvVar3 + uVar9 * 4);
    auVar17 = rsqrtss(auVar17,ZEXT416((uint)fVar15));
    fVar14 = auVar17._0_4_;
    fVar14 = roundf(fVar14 * -0.5 * auVar16._0_4_ * (fVar15 * fVar14 * fVar14 + -3.0));
    pvVar4 = (this->scales).data;
    fVar15 = roundf(fVar15 * (float)(int)fVar14);
    auVar18._0_4_ = (float)(int)fVar15;
    auVar18._4_4_ = (float)(int)extraout_var_00._0_4_;
    auVar18._8_4_ = (float)(int)extraout_var_00._4_4_;
    auVar18._12_4_ = (float)(int)extraout_var_00._8_4_;
    lVar6 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    pfVar7 = (float *)(lVar6 * uVar11 + (long)local_78.data);
    auVar17 = auVar18;
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      fVar15 = *(float *)((long)pvVar4 + uVar8 * 4) * 0.5;
      auVar17._0_4_ = fVar15 * (float)(int)fVar14;
      auVar17._4_4_ = fVar15 * auVar18._0_4_;
      auVar17._8_4_ = fVar15 * (float)(int)extraout_XMM0_Db;
      auVar17._12_4_ = fVar15 * auVar18._4_4_;
      *pfVar7 = fVar13 - auVar17._0_4_;
      pfVar7[1] = fVar13 - auVar17._4_4_;
      pfVar7[2] = auVar17._0_4_ + fVar13;
      pfVar7[3] = auVar17._4_4_ + fVar13;
      pfVar7 = (float *)((long)pfVar7 + lVar6);
    }
    uVar11 = uVar11 + (long)(int)uVar2;
  }
  Mat::operator=(&this->anchors,&local_78);
  Mat::~Mat(&local_78);
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}